

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test9::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test9 *this,_test_case *test_case)

{
  ulong uVar1;
  _test_case *operation_type;
  uint uVar2;
  _variable_type _Var3;
  _variable_type type;
  ostream *poVar4;
  GPUShaderFP64Test9 *pGVar5;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type type_03;
  _variable_type extraout_EDX;
  _variable_type type_04;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  string ref2_variable_type_fp_string;
  string ref2_variable_type;
  string variable_type_string;
  string result_variable_type_string;
  string ref2_variable_name;
  string ref2_variable_type_string;
  string variable_type_fp_string;
  stringstream result_sstream;
  allocator<char> local_2b1;
  _test_case *local_2b0;
  string *local_2a8;
  ulong local_2a0;
  string local_298;
  string local_278 [32];
  string local_258;
  string local_238;
  string local_218 [32];
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  GPUShaderFP64Test9 local_1a8 [2];
  
  local_2a8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  Utils::getVariableTypeString_abi_cxx11_
            (&local_238,(Utils *)(ulong)test_case->variable_type,type_00);
  Utils::getFPVariableTypeStringForVariableType_abi_cxx11_
            (&local_1d8,(Utils *)(ulong)test_case->variable_type,type_01);
  Utils::getVariableTypeString_abi_cxx11_
            (&local_258,(Utils *)(ulong)test_case->variable_type,type_02);
  uVar2 = Utils::getNumberOfComponentsForVariableType(test_case->variable_type);
  local_2b0 = test_case;
  if (((test_case->operation_type == OPERATION_TYPE_MULTIPLICATION) &&
      (_Var3 = test_case->variable_type, _Var3 < VARIABLE_TYPE_UINT)) &&
     ((0x7fc03fe0U >> (_Var3 & VARIABLE_TYPE_UINT) & 1) != 0)) {
    _Var3 = Utils::getTransposedMatrixVariableType(_Var3);
    _Var3 = Utils::getPostMatrixMultiplicationVariableType(local_2b0->variable_type,_Var3);
    Utils::getVariableTypeString_abi_cxx11_(&local_298,(Utils *)(ulong)_Var3,type_03);
    std::__cxx11::string::operator=((string *)&local_238,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    local_2b0->result_variable_type = _Var3;
  }
  poVar4 = std::operator<<((ostream *)local_1a8,"#version 400\n\nout ");
  poVar4 = std::operator<<(poVar4,(string *)&local_238);
  std::operator<<(poVar4,
                  " result;\nout ivec2 result_lt;\nout ivec2 result_lte;\nout ivec2 result_gt;\nout ivec2 result_gte;\nvoid main()\n{\n"
                 );
  poVar4 = std::operator<<((ostream *)local_1a8,(string *)&local_258);
  poVar4 = std::operator<<(poVar4," reference1 = ");
  poVar4 = std::operator<<(poVar4,(string *)&local_258);
  std::operator<<(poVar4,"(");
  uVar7 = (ulong)uVar2;
  uVar11 = 0;
  while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
    uVar1 = uVar11 + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    bVar13 = uVar11 != uVar2 - 1;
    uVar11 = uVar1;
    if (bVar13) {
      std::operator<<((ostream *)local_1a8,", ");
    }
  }
  std::operator<<((ostream *)local_1a8,");\n");
  local_2a0 = 0;
  uVar6 = extraout_RDX;
  while( true ) {
    _Var3 = (_variable_type)uVar6;
    if ((int)local_2a0 == 2) break;
    type = local_2b0->variable_type;
    if (((type < VARIABLE_TYPE_UINT) && ((0x7fc03fe0U >> (type & VARIABLE_TYPE_UINT) & 1) != 0)) &&
       (local_2b0->operation_type == OPERATION_TYPE_MULTIPLICATION)) {
      type = Utils::getTransposedMatrixVariableType(type);
      _Var3 = extraout_EDX;
    }
    Utils::getFPVariableTypeStringForVariableType_abi_cxx11_(&local_298,(Utils *)(ulong)type,_Var3);
    Utils::getVariableTypeString_abi_cxx11_(&local_1f8,(Utils *)(ulong)type,type_04);
    iVar10 = (int)local_2a0;
    psVar8 = &local_1f8;
    if (iVar10 == 0) {
      psVar8 = &local_298;
    }
    std::__cxx11::string::string(local_278,(string *)psVar8);
    pcVar9 = "reference2";
    if (iVar10 == 0) {
      pcVar9 = "reference2f";
    }
    std::__cxx11::string::string<std::allocator<char>>(local_218,pcVar9,&local_2b1);
    poVar4 = std::operator<<((ostream *)local_1a8,local_278);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,local_218);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,local_278);
    std::operator<<(poVar4,"(");
    for (lVar12 = 0; ((ulong)uVar2 - 1) + lVar12 != -1; lVar12 = lVar12 + -1) {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      if (-lVar12 != (ulong)(uVar2 - 1)) {
        std::operator<<((ostream *)local_1a8,", ");
      }
    }
    std::operator<<((ostream *)local_1a8,");\n");
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_298);
    local_2a0 = (ulong)((int)local_2a0 + 1);
    uVar6 = extraout_RDX_00;
  }
  pGVar5 = local_1a8;
  std::operator<<((ostream *)local_1a8,"\nresult = ");
  operation_type = local_2b0;
  if ((local_2b0->operation_type & ~OPERATION_TYPE_DIVISION) == OPERATION_TYPE_PRE_DECREMENTATION) {
    pcVar9 = getOperatorForOperationType(pGVar5,&local_2b0->operation_type);
    std::operator<<((ostream *)local_1a8,pcVar9);
  }
  pGVar5 = local_1a8;
  std::operator<<((ostream *)local_1a8,"reference1 ");
  if ((operation_type->operation_type & ~OPERATION_TYPE_SUBTRACTION) ==
      OPERATION_TYPE_PRE_DECREMENTATION) {
    if ((~operation_type->operation_type & 6) != 0) goto LAB_009f2d17;
    pcVar9 = getOperatorForOperationType(pGVar5,&operation_type->operation_type);
    pGVar5 = local_1a8;
  }
  else {
    pcVar9 = getOperatorForOperationType(pGVar5,&operation_type->operation_type);
    pGVar5 = (GPUShaderFP64Test9 *)std::operator<<((ostream *)local_1a8,pcVar9);
    pcVar9 = " reference2";
  }
  std::operator<<((ostream *)pGVar5,pcVar9);
LAB_009f2d17:
  std::operator<<((ostream *)local_1a8,";\n");
  bVar13 = Utils::isScalarVariableType(operation_type->variable_type);
  pcVar9 = 
  "result_lt [0] = 1;\nresult_lt [1] = 1;\nresult_lte[0] = 1;\nresult_lte[1] = 1;\nresult_gt [0] = 1;\nresult_gt [1] = 1;\nresult_gte[0] = 1;\nresult_gte[1] = 1;\n"
  ;
  if (bVar13) {
    pcVar9 = 
    "result_lt [0] = (reference1 <  reference2)  ? 1 : 0;\nresult_lt [1] = (reference1 <  reference2f) ? 1 : 0;\nresult_lte[0] = (reference1 <= reference2)  ? 1 : 0;\nresult_lte[1] = (reference1 <= reference2f) ? 1 : 0;\nresult_gt [0] = (reference1 >  reference2)  ? 1 : 0;\nresult_gt [1] = (reference1 >  reference2f) ? 1 : 0;\nresult_gte[0] = (reference1 >= reference2)  ? 1 : 0;\nresult_gte[1] = (reference1 >= reference2f) ? 1 : 0;\n"
    ;
  }
  std::operator<<((ostream *)local_1a8,pcVar9);
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return local_2a8;
}

Assistant:

std::string GPUShaderFP64Test9::getVertexShaderBody(_test_case& test_case)
{
	std::stringstream  result_sstream;
	std::string		   result_variable_type_string = Utils::getVariableTypeString(test_case.variable_type);
	std::string		   variable_type_fp_string = Utils::getFPVariableTypeStringForVariableType(test_case.variable_type);
	std::string		   variable_type_string	= Utils::getVariableTypeString(test_case.variable_type);
	const unsigned int n_variable_components   = Utils::getNumberOfComponentsForVariableType(test_case.variable_type);

	/* If we are to multiply matrices, we will need to use a different type
	 * for the result variable if either of the matrices is not square.
	 */
	if (test_case.operation_type == OPERATION_TYPE_MULTIPLICATION &&
		Utils::isMatrixVariableType(test_case.variable_type))
	{
		Utils::_variable_type result_variable_type;
		Utils::_variable_type transposed_matrix_variable_type =
			Utils::getTransposedMatrixVariableType(test_case.variable_type);

		result_variable_type =
			Utils::getPostMatrixMultiplicationVariableType(test_case.variable_type, transposed_matrix_variable_type);
		result_variable_type_string = Utils::getVariableTypeString(result_variable_type);

		test_case.result_variable_type = result_variable_type;
	}

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"

					  /* Add output variables */
					  "out "
				   << result_variable_type_string << " result;\n"
													 "out ivec2 result_lt;\n"
													 "out ivec2 result_lte;\n"
													 "out ivec2 result_gt;\n"
													 "out ivec2 result_gte;\n"
													 "void main()\n"
													 "{\n";

	/* Form reference values */
	result_sstream << variable_type_string << " reference1 = " << variable_type_string << "(";

	for (unsigned int n_variable_component = 0; n_variable_component < n_variable_components; ++n_variable_component)
	{
		result_sstream << (n_variable_component + 1);

		if (n_variable_component != (n_variable_components - 1))
		{
			result_sstream << ", ";
		}
	} /* for (all variable components) */

	result_sstream << ");\n";

	for (unsigned int n_ref2_case = 0; n_ref2_case < 2; /* single- and double-precision cases */
		 ++n_ref2_case)
	{
		Utils::_variable_type compatible_variable_type = test_case.variable_type;

		if (Utils::isMatrixVariableType(compatible_variable_type) &&
			test_case.operation_type == OPERATION_TYPE_MULTIPLICATION)
		{
			compatible_variable_type = Utils::getTransposedMatrixVariableType(compatible_variable_type);
		}

		std::string ref2_variable_type_fp_string =
			Utils::getFPVariableTypeStringForVariableType(compatible_variable_type);
		std::string ref2_variable_type_string = Utils::getVariableTypeString(compatible_variable_type);
		std::string ref2_variable_type = (n_ref2_case == 0) ? ref2_variable_type_fp_string : ref2_variable_type_string;
		std::string ref2_variable_name = (n_ref2_case == 0) ? "reference2f" : "reference2";

		result_sstream << ref2_variable_type << " " << ref2_variable_name << " = " << ref2_variable_type << "(";

		for (unsigned int n_variable_component = 0; n_variable_component < n_variable_components;
			 ++n_variable_component)
		{
			result_sstream << (n_variable_components - (n_variable_component + 1));

			if (n_variable_component != (n_variable_components - 1))
			{
				result_sstream << ", ";
			}
		} /* for (all variable components) */

		result_sstream << ");\n";
	} /* for (both reference2 declarations) */

	/* Add actual body */
	result_sstream << "\n"
					  "result = ";

	if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION)
	{
		result_sstream << getOperatorForOperationType(test_case.operation_type);
	}

	result_sstream << "reference1 ";

	if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
	{
		if (test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION ||
			test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
		{
			result_sstream << getOperatorForOperationType(test_case.operation_type);
		}
	}
	else
	{
		result_sstream << getOperatorForOperationType(test_case.operation_type) << " reference2";
	}

	result_sstream << ";\n";

	if (Utils::isScalarVariableType(test_case.variable_type))
	{
		result_sstream << "result_lt [0] = (reference1 <  reference2)  ? 1 : 0;\n"
						  "result_lt [1] = (reference1 <  reference2f) ? 1 : 0;\n"
						  "result_lte[0] = (reference1 <= reference2)  ? 1 : 0;\n"
						  "result_lte[1] = (reference1 <= reference2f) ? 1 : 0;\n"
						  "result_gt [0] = (reference1 >  reference2)  ? 1 : 0;\n"
						  "result_gt [1] = (reference1 >  reference2f) ? 1 : 0;\n"
						  "result_gte[0] = (reference1 >= reference2)  ? 1 : 0;\n"
						  "result_gte[1] = (reference1 >= reference2f) ? 1 : 0;\n";
	}
	else
	{
		result_sstream << "result_lt [0] = 1;\n"
						  "result_lt [1] = 1;\n"
						  "result_lte[0] = 1;\n"
						  "result_lte[1] = 1;\n"
						  "result_gt [0] = 1;\n"
						  "result_gt [1] = 1;\n"
						  "result_gte[0] = 1;\n"
						  "result_gte[1] = 1;\n";
	}

	result_sstream << "}\n";

	/* All done */
	return result_sstream.str();
}